

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::anon_unknown_0::ParserValidationErrorTest_ImportTwice_Test::
~ParserValidationErrorTest_ImportTwice_Test(ParserValidationErrorTest_ImportTwice_Test *this)

{
  ParserTest::~ParserTest(&this->super_ParserValidationErrorTest);
  operator_delete(this,0xf0);
  return;
}

Assistant:

TEST_F(ParserValidationErrorTest, ImportTwice) {
  FileDescriptorProto other_file;
  other_file.set_name("bar.proto");
  other_file.add_message_type()->set_name("foo");
  EXPECT_TRUE(pool_.BuildFile(other_file) != nullptr);

  ExpectHasValidationErrors(
      "package test;\n"
      "\n"
      "import \"bar.proto\";\n"
      "  import \"bar.proto\";",
      "3:2: Import \"bar.proto\" was listed twice.\n");
}